

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_biased.h
# Opt level: O0

uint64_t absl::lts_20250127::profiling_internal::ExponentialBiased::NextRandom(uint64_t rnd)

{
  uint64_t prng_mod_mask;
  uint64_t prng_mod_power;
  uint64_t prng_add;
  uint64_t prng_mult;
  uint64_t rnd_local;
  
  return rnd * 0x5deece66d + 0xb & 0xffffffffffff;
}

Assistant:

inline uint64_t ExponentialBiased::NextRandom(uint64_t rnd) {
  const uint64_t prng_mult = uint64_t{0x5DEECE66D};
  const uint64_t prng_add = 0xB;
  const uint64_t prng_mod_power = 48;
  const uint64_t prng_mod_mask =
      ~((~static_cast<uint64_t>(0)) << prng_mod_power);
  return (prng_mult * rnd + prng_add) & prng_mod_mask;
}